

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

void __thiscall
testing::internal::ScopedTrace::ScopedTrace(ScopedTrace *this,char *file,int line,Message *message)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__str;
  undefined1 local_68 [8];
  TraceInfo trace;
  
  trace._8_8_ = &trace.message._M_string_length;
  trace.message._M_dataplus._M_p = (pointer)0x0;
  trace.message._M_string_length._0_1_ = 0;
  local_68 = (undefined1  [8])file;
  trace.file._0_4_ = line;
  Message::GetString_abi_cxx11_((string *)((long)&trace.message.field_2 + 8),message);
  __str = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          (trace.message.field_2._M_local_buf + 8);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&trace.line,__str)
  ;
  std::__cxx11::string::~string((string *)__str);
  UnitTest::GetInstance();
  UnitTest::PushGTestTrace(&UnitTest::GetInstance::instance,(TraceInfo *)local_68);
  std::__cxx11::string::~string((string *)&trace.line);
  return;
}

Assistant:

GTEST_LOCK_EXCLUDED_(&UnitTest::mutex_) {
  TraceInfo trace;
  trace.file = file;
  trace.line = line;
  trace.message = message.GetString();

  UnitTest::GetInstance()->PushGTestTrace(trace);
}